

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O3

void cpu_set_cwp_sparc(CPUSPARCState *env,int new_cwp)

{
  uint32_t uVar1;
  undefined8 uVar2;
  ulong uVar3;
  
  uVar1 = env->nwindows;
  if (env->cwp == uVar1 - 1) {
    uVar2 = *(undefined8 *)(env->regbase + (uVar1 << 4) + 2);
    *(undefined8 *)env->regbase = *(undefined8 *)(env->regbase + (uVar1 << 4));
    *(undefined8 *)(env->regbase + 2) = uVar2;
    uVar2 = *(undefined8 *)(env->regbase + (ulong)(uVar1 << 4) + 4 + 2);
    *(undefined8 *)(env->regbase + 4) = *(undefined8 *)(env->regbase + (ulong)(uVar1 << 4) + 4);
    *(undefined8 *)(env->regbase + 6) = uVar2;
  }
  env->cwp = new_cwp;
  if (uVar1 - 1 == new_cwp) {
    uVar3 = (ulong)(uVar1 << 4);
    env->regbase[uVar3] = env->regbase[0];
    env->regbase[uVar3 + 1] = env->regbase[1];
    env->regbase[uVar3 + 2] = env->regbase[2];
    env->regbase[uVar3 + 3] = env->regbase[3];
    env->regbase[uVar3 + 4] = env->regbase[4];
    env->regbase[uVar3 + 5] = env->regbase[5];
    env->regbase[uVar3 + 6] = env->regbase[6];
    env->regbase[uVar3 + 7] = env->regbase[7];
  }
  env->regwptr = env->regbase + (new_cwp << 4);
  return;
}

Assistant:

void cpu_set_cwp(CPUSPARCState *env, int new_cwp)
{
    /* put the modified wrap registers at their proper location */
    if (env->cwp == env->nwindows - 1) {
        memcpy32(env->regbase, env->regbase + env->nwindows * 16);
    }
    env->cwp = new_cwp;

    /* put the wrap registers at their temporary location */
    if (new_cwp == env->nwindows - 1) {
        memcpy32(env->regbase + env->nwindows * 16, env->regbase);
    }
    env->regwptr = env->regbase + (new_cwp * 16);
}